

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::ClearPartialCollect(Recycler *this)

{
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  undefined4 *puVar2;
  Type pSVar3;
  code *pcVar4;
  bool bVar5;
  Type buffer;
  undefined8 *in_FS_OFFSET;
  
  bVar5 = DoQueueTrackedObject(this);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x10a1,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  (this->autoHeap).unusedPartialCollectFreeBytes = 0;
  this->partialUncollectedAllocBytes = 0;
  pSVar1 = &this->clientTrackedObjectList;
  buffer = (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next;
  if ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)buffer != pSVar1) {
    do {
      pSVar3 = buffer->next;
      ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&(this->clientTrackedObjectAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,
                 0x10);
      buffer = pSVar3;
    } while ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)pSVar3 != pSVar1);
  }
  (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (this->clientTrackedObjectList).super_RealCount.count = 0;
  this->uncollectedNewPageCountPartialCollect = 0xffffffffffffffff;
  return;
}

Assistant:

void
Recycler::ClearPartialCollect()
{
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif
    this->autoHeap.unusedPartialCollectFreeBytes = 0;
    this->partialUncollectedAllocBytes = 0;
    this->clientTrackedObjectList.Clear(&this->clientTrackedObjectAllocator);
    this->uncollectedNewPageCountPartialCollect = (size_t)-1;
}